

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O3

void __thiscall
soul::TokenisedPathString::TokenisedPathString(TokenisedPathString *this,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t *psVar3;
  pointer pcVar4;
  ulong uVar5;
  Section *pSVar6;
  size_t sVar7;
  undefined8 uVar8;
  size_t sVar9;
  ulong uVar10;
  
  paVar1 = &(this->fullPath).field_2;
  (this->fullPath)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (path->_M_dataplus)._M_p;
  paVar2 = &path->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar8 = *(undefined8 *)((long)&path->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->fullPath).field_2 + 8) = uVar8;
  }
  else {
    (this->fullPath)._M_dataplus._M_p = pcVar4;
    (this->fullPath).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->fullPath)._M_string_length = path->_M_string_length;
  (path->_M_dataplus)._M_p = (pointer)paVar2;
  path->_M_string_length = 0;
  (path->field_2)._M_local_buf[0] = '\0';
  (this->sections).items = (Section *)(this->sections).space;
  (this->sections).numActive = 0;
  (this->sections).numAllocated = 8;
  uVar5 = (this->fullPath)._M_string_length;
  if (uVar5 != 0) {
    uVar10 = 0;
    do {
      sVar9 = std::__cxx11::string::find((char *)this,0x27d8da,uVar10);
      if (sVar9 == 0xffffffffffffffff) {
        ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::reserve
                  (&this->sections,(this->sections).numActive + 1);
        pSVar6 = (this->sections).items;
        sVar9 = (this->sections).numActive;
        pSVar6[sVar9].start = uVar10;
        pSVar6[sVar9].end = uVar5;
        psVar3 = &(this->sections).numActive;
        *psVar3 = *psVar3 + 1;
        return;
      }
      if (sVar9 == 0) {
        throwInternalCompilerError("nextBreak != 0","TokenisedPathString",0x7d);
      }
      ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::reserve
                (&this->sections,(this->sections).numActive + 1);
      pSVar6 = (this->sections).items;
      sVar7 = (this->sections).numActive;
      pSVar6[sVar7].start = uVar10;
      pSVar6[sVar7].end = sVar9;
      psVar3 = &(this->sections).numActive;
      *psVar3 = *psVar3 + 1;
      uVar10 = sVar9 + 2;
    } while (uVar10 < uVar5);
  }
  return;
}

Assistant:

TokenisedPathString (std::string path) : fullPath (std::move (path))
    {
        size_t currentSectionStart = 0;
        auto length = fullPath.length();

        while (currentSectionStart < length)
        {
            auto nextBreak = fullPath.find ("::", currentSectionStart);
            SOUL_ASSERT (nextBreak != 0);

            if (nextBreak == std::string::npos)
            {
                sections.push_back ({ currentSectionStart, length });
                break;
            }

            sections.push_back ({ currentSectionStart, nextBreak });
            currentSectionStart = nextBreak + 2;
        }
    }